

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_upsert.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::Transformer::TransformConflictTarget_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,Transformer *this,PGList *list)

{
  NotImplementedException *pNVar1;
  PGListCell *pPVar2;
  optional_ptr<duckdb_libpgquery::PGIndexElem,_true> index_element;
  optional_ptr<duckdb_libpgquery::PGIndexElem,_true> local_50;
  string local_48;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar2 = list->head;
  if (pPVar2 != (PGListCell *)0x0) {
    do {
      local_50.ptr = (PGIndexElem *)(pPVar2->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::CheckValid(&local_50);
      if ((local_50.ptr)->collation != (PGList *)0x0) {
        pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Index with collation not supported yet!","");
        NotImplementedException::NotImplementedException(pNVar1,&local_48);
        __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::CheckValid(&local_50);
      if ((local_50.ptr)->opclass != (PGList *)0x0) {
        pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Index with opclass not supported yet!","");
        NotImplementedException::NotImplementedException(pNVar1,&local_48);
        __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::CheckValid(&local_50);
      if ((local_50.ptr)->name == (char *)0x0) {
        pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Non-column index element not supported yet!","");
        NotImplementedException::NotImplementedException(pNVar1,&local_48);
        __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::CheckValid(&local_50);
      if ((local_50.ptr)->nulls_ordering != PG_SORTBY_NULLS_DEFAULT) {
        pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Index with null_ordering not supported yet!","");
        NotImplementedException::NotImplementedException(pNVar1,&local_48);
        __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::CheckValid(&local_50);
      if ((local_50.ptr)->ordering != PG_SORTBY_DEFAULT) {
        pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Index with ordering not supported yet!","");
        NotImplementedException::NotImplementedException(pNVar1,&local_48);
        __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::CheckValid(&local_50);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&(local_50.ptr)->name);
      pPVar2 = pPVar2->next;
    } while (pPVar2 != (PGListCell *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> Transformer::TransformConflictTarget(duckdb_libpgquery::PGList &list) {
	vector<string> columns;
	for (auto cell = list.head; cell != nullptr; cell = cell->next) {
		auto index_element = PGPointerCast<duckdb_libpgquery::PGIndexElem>(cell->data.ptr_value);
		if (index_element->collation) {
			throw NotImplementedException("Index with collation not supported yet!");
		}
		if (index_element->opclass) {
			throw NotImplementedException("Index with opclass not supported yet!");
		}
		if (!index_element->name) {
			throw NotImplementedException("Non-column index element not supported yet!");
		}
		if (index_element->nulls_ordering) {
			throw NotImplementedException("Index with null_ordering not supported yet!");
		}
		if (index_element->ordering) {
			throw NotImplementedException("Index with ordering not supported yet!");
		}
		columns.emplace_back(index_element->name);
	}
	return columns;
}